

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O0

void __thiscall
QMdi::ControlElement<QMdi::ControlLabel>::ControlElement
          (ControlElement<QMdi::ControlLabel> *this,QMdiSubWindow *child)

{
  QPointer<QMdiSubWindow> *in_RSI;
  QMdiSubWindow *in_RDI;
  QWidget *unaff_retaddr;
  
  ControlLabel::ControlLabel((ControlLabel *)child,unaff_retaddr);
  *(undefined ***)&in_RDI->super_QWidget = &PTR_metaObject_00d17938;
  *(undefined ***)&(in_RDI->super_QWidget).super_QPaintDevice = &PTR__ControlElement_00d17ae8;
  QPointer<QMdiSubWindow>::QPointer((QPointer<QMdiSubWindow> *)0x6388c0);
  QPointer<QMdiSubWindow>::operator=(in_RSI,in_RDI);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }